

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O1

int KangarooTwelve(uchar *input,size_t inLen,uchar *output,size_t outLen,uchar *customization,
                  size_t customLen)

{
  int iVar1;
  int iVar2;
  KangarooTwelve_Instance ktInstance;
  KangarooTwelve_Instance KStack_1f8;
  
  iVar2 = 1;
  if (outLen != 0) {
    KStack_1f8.queueAbsorbedLen = 0;
    KStack_1f8.phase = ABSORBING;
    KStack_1f8.blockNumber = 0;
    KStack_1f8.fixedOutputLength = outLen;
    iVar1 = KeccakWidth1600_12rounds_SpongeInitialize(&KStack_1f8.finalNode,0x540,0x100);
    if (iVar1 == 0) {
      iVar1 = KangarooTwelve_Update(&KStack_1f8,input,inLen);
      if (iVar1 == 0) {
        iVar2 = KangarooTwelve_Final(&KStack_1f8,output,customization,customLen);
      }
    }
  }
  return iVar2;
}

Assistant:

int KangarooTwelve( const unsigned char * input, size_t inLen, unsigned char * output, size_t outLen, const unsigned char * customization, size_t customLen )
{
    KangarooTwelve_Instance ktInstance;

    if (outLen == 0)
        return 1;
    if (KangarooTwelve_Initialize(&ktInstance, outLen) != 0)
        return 1;
    if (KangarooTwelve_Update(&ktInstance, input, inLen) != 0)
        return 1;
    return KangarooTwelve_Final(&ktInstance, output, customization, customLen);
}